

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseAction(JSONParser *this,Action *out_action)

{
  bool bVar1;
  Result RVar2;
  Action *out_action_local;
  JSONParser *this_local;
  
  RVar2 = ExpectKey(this,"action");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = Expect(this,"{");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = ExpectKey(this,"type");
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        bVar1 = Match(this,"\"invoke\"");
        if (bVar1) {
          out_action->type = Invoke;
        }
        else {
          RVar2 = Expect(this,"\"get\"");
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          out_action->type = Get;
        }
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          bVar1 = Match(this,"\"module\"");
          if (bVar1) {
            RVar2 = Expect(this,":");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2 = ParseString(this,&out_action->module_name);
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar2 = ParseKeyStringValue(this,"field",&out_action->field_name);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            if (out_action->type == Invoke) {
              RVar2 = Expect(this,",");
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              RVar2 = ExpectKey(this,"args");
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              RVar2 = ParseConstVector(this,&out_action->types,&out_action->args);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            RVar2 = Expect(this,"}");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
            }
          }
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseAction(Action* out_action) {
  EXPECT_KEY("action");
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"invoke\"")) {
    out_action->type = ActionType::Invoke;
  } else {
    EXPECT("\"get\"");
    out_action->type = ActionType::Get;
  }
  EXPECT(",");
  if (Match("\"module\"")) {
    EXPECT(":");
    CHECK_RESULT(ParseString(&out_action->module_name));
    EXPECT(",");
  }
  PARSE_KEY_STRING_VALUE("field", &out_action->field_name);
  if (out_action->type == ActionType::Invoke) {
    EXPECT(",");
    EXPECT_KEY("args");
    CHECK_RESULT(ParseConstVector(&out_action->types, &out_action->args));
  }
  EXPECT("}");
  return wabt::Result::Ok;
}